

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * Inline::GetDefInstr(Opnd *linkOpnd)

{
  code *pcVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  StackSym *this;
  undefined4 *puVar4;
  
  pSVar3 = IR::Opnd::AsSymOpnd(linkOpnd);
  this = Sym::AsStackSym(pSVar3->m_sym);
  if ((this->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x9a4,"(linkSym->m_isSingleDef)","linkSym->m_isSingleDef");
    if (!bVar2) goto LAB_0050839b;
    *puVar4 = 0;
  }
  bVar2 = StackSym::IsArgSlotSym(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x9a5,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
    if (!bVar2) {
LAB_0050839b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (this->field_5).m_instrDef;
}

Assistant:

IR::Instr* Inline::GetDefInstr(IR::Opnd* linkOpnd)
{
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    Assert(linkSym->m_isSingleDef);
    Assert(linkSym->IsArgSlotSym());

    return linkSym->m_instrDef;
}